

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

void duckdb::Bit::NumericToBit<long>(long numeric,bitstring_t *output_str)

{
  char *pcVar1;
  long lVar2;
  char cStack_9;
  long numeric_local;
  
  if ((output_str->value).pointer.length < 0xd) {
    pcVar1 = (output_str->value).pointer.prefix;
  }
  else {
    pcVar1 = (output_str->value).pointer.ptr;
  }
  *pcVar1 = '\0';
  lVar2 = 8;
  while( true ) {
    pcVar1 = pcVar1 + 1;
    if (lVar2 == 0) break;
    *pcVar1 = (&cStack_9)[lVar2];
    lVar2 = lVar2 + -1;
  }
  numeric_local = numeric;
  Finalize(output_str);
  return;
}

Assistant:

void Bit::NumericToBit(T numeric, bitstring_t &output_str) {
	D_ASSERT(output_str.GetSize() >= sizeof(T) + 1);

	auto output = output_str.GetDataWriteable();
	auto data = const_data_ptr_cast(&numeric);

	*output = 0; // set padding to 0
	++output;
	for (idx_t idx = 0; idx < sizeof(T); ++idx) {
		output[idx] = static_cast<char>(data[sizeof(T) - idx - 1]);
	}
	Bit::Finalize(output_str);
}